

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

bool isItRandom<ThreeWiseHash<unsigned_long_long,unsigned_char>>(uint L)

{
  int k;
  undefined1 *puVar1;
  long lVar2;
  pointer pCVar3;
  ostream *poVar4;
  size_t k_1;
  value_type *__val;
  unsigned_long_long answer;
  ulong uVar5;
  unsigned_long_long answer_1;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  ThreeWiseHash<unsigned_long_long,_unsigned_char> hf;
  ThreeWiseHash<unsigned_long_long,_unsigned_char> base;
  ThreeWiseHash<unsigned_long_long,_unsigned_char> local_1120;
  ThreeWiseHash<unsigned_long_long,_unsigned_char> local_8a8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"checking that it is randomized ",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  puVar1 = (undefined1 *)operator_new(5);
  *puVar1 = 0;
  *(undefined4 *)(puVar1 + 1) = 0;
  lVar2 = 0;
  do {
    puVar1[lVar2] = (char)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  ThreeWiseHash<unsigned_long_long,_unsigned_char>::ThreeWiseHash(&local_8a8,5,L);
  lVar2 = 0;
  uVar5 = 0;
  pCVar3 = local_8a8.hashers.
           super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    uVar5 = uVar5 ^ pCVar3->hashvalues[(byte)puVar1[lVar2]];
    lVar2 = lVar2 + 1;
    pCVar3 = pCVar3 + 1;
  } while (lVar2 != 5);
  uVar7 = 0;
  bVar8 = true;
  do {
    ThreeWiseHash<unsigned_long_long,_unsigned_char>::ThreeWiseHash(&local_1120,5,L);
    lVar2 = 0;
    uVar6 = 0;
    pCVar3 = local_1120.hashers.
             super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar6 = uVar6 ^ pCVar3->hashvalues[(byte)puVar1[lVar2]];
      lVar2 = lVar2 + 1;
      pCVar3 = pCVar3 + 1;
    } while (lVar2 != 5);
    if (uVar6 == uVar5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"collision ",10);
      poVar4 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"It is randomized! ",0x12);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      poVar4 = (ostream *)&std::cout;
    }
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if (local_1120.hashers.
        super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1120.hashers.
                      super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
              (&local_1120.ngram.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (uVar6 != uVar5) goto LAB_001073d9;
    bVar8 = uVar7 < 99;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Not randomized! ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
LAB_001073d9:
  if (local_8a8.hashers.
      super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8a8.hashers.
                    super__Vector_base<CharacterHash<unsigned_long_long,_unsigned_char>,_std::allocator<CharacterHash<unsigned_long_long,_unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
            (&local_8a8.ngram.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
  operator_delete(puVar1);
  return bVar8;
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}